

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitSwitch(TOutputTraverser *this,TVisit param_1,TIntermSwitch *node)

{
  TInfoSink *infoSink;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TInfoSink *out;
  TIntermSwitch *node_local;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&infoSink->debug,"switch");
  bVar1 = TIntermSwitch::getFlatten(node);
  if (bVar1) {
    TInfoSinkBase::operator<<(&infoSink->debug,": Flatten");
  }
  bVar1 = TIntermSwitch::getDontFlatten(node);
  if (bVar1) {
    TInfoSinkBase::operator<<(&infoSink->debug,": DontFlatten");
  }
  TInfoSinkBase::operator<<(&infoSink->debug,"\n");
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&infoSink->debug,"condition\n");
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + 1;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + -1;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&infoSink->debug,"body\n");
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + 1;
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var_00,iVar2),this);
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitSwitch(TVisit /* visit */, TIntermSwitch* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);
    out.debug << "switch";

    if (node->getFlatten())
        out.debug << ": Flatten";
    if (node->getDontFlatten())
        out.debug << ": DontFlatten";
    out.debug << "\n";

    OutputTreeText(out, node, depth);
    out.debug << "condition\n";
    ++depth;
    node->getCondition()->traverse(this);

    --depth;
    OutputTreeText(out, node, depth);
    out.debug << "body\n";
    ++depth;
    node->getBody()->traverse(this);

    --depth;

    return false;
}